

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

If_DsdMan_t * If_DsdManFilter(If_DsdMan_t *p,int Limit)

{
  int iVar1;
  If_DsdMan_t *pNew_00;
  Vec_Int_t *p_00;
  void *pvVar2;
  int local_34;
  int i;
  Vec_Int_t *vMap;
  If_DsdObj_t *pObj;
  If_DsdMan_t *pNew;
  int Limit_local;
  If_DsdMan_t *p_local;
  
  pNew_00 = If_DsdManAlloc(p->nVars,p->LutSize);
  iVar1 = Vec_PtrSize(&p->vObjs);
  p_00 = Vec_IntStartFull(iVar1);
  Vec_IntWriteEntry(p_00,0,0);
  Vec_IntWriteEntry(p_00,1,1);
  for (local_34 = 2; iVar1 = Vec_PtrSize(&p->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar2 = Vec_PtrEntry(&p->vObjs,local_34);
    if (Limit <= (int)(*(uint *)((long)pvVar2 + 4) >> 9 & 0x3ffff)) {
      If_DsdManFilter_rec(pNew_00,p,local_34,p_00);
    }
  }
  Vec_IntFree(p_00);
  return pNew_00;
}

Assistant:

If_DsdMan_t * If_DsdManFilter( If_DsdMan_t * p, int Limit )
{
    If_DsdMan_t * pNew = If_DsdManAlloc( p->nVars, p->LutSize );
    If_DsdObj_t * pObj; 
    Vec_Int_t * vMap;
    int i;
    vMap = Vec_IntStartFull( Vec_PtrSize(&p->vObjs) );
    Vec_IntWriteEntry( vMap, 0, 0 );
    Vec_IntWriteEntry( vMap, 1, 1 );
    If_DsdVecForEachNode( &p->vObjs, pObj, i )
        if ( (int)pObj->Count >= Limit )
            If_DsdManFilter_rec( pNew, p, i, vMap );
    Vec_IntFree( vMap );
    return pNew;
}